

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stack.hpp
# Opt level: O2

void __thiscall
Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::IntegerConstantType>_>::~Stack
          (Stack<std::pair<Kernel::TermSpec,_Kernel::IntegerConstantType>_> *this)

{
  pair<Kernel::TermSpec,_Kernel::IntegerConstantType> *ppVar1;
  
  for (ppVar1 = this->_cursor; ppVar1 != this->_stack; ppVar1 = ppVar1 + -1) {
    Kernel::IntegerConstantType::~IntegerConstantType(&ppVar1[-1].second);
  }
  if (ppVar1 != (pair<Kernel::TermSpec,_Kernel::IntegerConstantType> *)0x0) {
    Lib::free(this->_stack);
  }
  return;
}

Assistant:

inline ~Stack()
  {
    //The while cycle is completely eliminated by compiler
    //in "-O6 -DVDEBUG=0" mode for types without destructor,
    //so this destructor is constant time.
    C* p=_cursor;
    while(p!=_stack) {
      (--p)->~C();
    }
    if(_stack) {
      DEALLOC_KNOWN(_stack,_capacity*sizeof(C),className());
    }
    else {
      ASS_EQ(_capacity,0);
    }
  }